

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::SendKeepAlive
          (CommissionerImpl *this,Timer *param_1,bool aKeepAlive)

{
  uint uVar1;
  undefined4 uVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  _Alloc_hider _Var7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar8;
  bool bVar9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  Error error;
  writer write;
  Request request;
  undefined1 local_188 [8];
  uchar *local_180;
  char local_178 [8];
  uchar local_170 [16];
  undefined1 local_160 [8];
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined1 local_138 [8];
  _Alloc_hider _Stack_130;
  undefined1 local_128 [24];
  parse_func local_110 [1];
  string local_108;
  writer local_e8;
  char *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  Message local_b8;
  
  local_158._M_p = (pointer)&local_148;
  local_160._0_4_ = kNone;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  coap::Message::Message(&local_b8,kConfirmable,kPost);
  iVar4 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
  if ((char)iVar4 == '\0') {
    local_138 = (undefined1  [8])((ulong)local_138 & 0xffffffff00000000);
    pcVar8 = "cannot send keep-alive message the commissioner is not active";
    _Stack_130._M_p = "cannot send keep-alive message the commissioner is not active";
    local_128._0_8_ = 0x3d;
    local_128._8_8_ = 0;
    local_110[0] = (parse_func)0x0;
    local_128._16_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_138;
    local_e8.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_138;
    do {
      if (pcVar8 == "") break;
      pcVar6 = pcVar8;
      if (*pcVar8 == '{') {
LAB_001ba7ef:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)&local_e8,pcVar8,pcVar6);
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_138);
        bVar9 = true;
      }
      else {
        pcVar6 = pcVar8 + 1;
        bVar9 = pcVar6 != "";
        if (bVar9) {
          if (*pcVar6 != '{') {
            pcVar3 = pcVar8 + 2;
            do {
              pcVar6 = pcVar3;
              bVar9 = pcVar6 != "";
              if (pcVar6 == "") goto LAB_001ba7eb;
              pcVar3 = pcVar6 + 1;
            } while (*pcVar6 != '{');
          }
          bVar9 = true;
        }
LAB_001ba7eb:
        if (bVar9) goto LAB_001ba7ef;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)&local_e8,pcVar8,"");
        bVar9 = false;
      }
    } while (bVar9);
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_138;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_108,(v10 *)"cannot send keep-alive message the commissioner is not active",
               (string_view)ZEXT816(0x3d),args_00);
    local_188._0_4_ = 0xf;
    local_180 = local_170;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,local_108._M_dataplus._M_p,
               (parse_func)(local_108._M_string_length + (long)local_108._M_dataplus._M_p));
    local_160._0_4_ = local_188._0_4_;
    std::__cxx11::string::operator=((string *)&local_158,(string *)&local_180);
    if (local_180 != local_170) {
      operator_delete(local_180);
    }
    _Var7._M_p = local_108._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == &local_108.field_2) goto LAB_001ba8b5;
  }
  else {
    local_188 = (undefined1  [8])local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/c/ca","");
    coap::Message::SetUriPath((Error *)local_138,&local_b8,(string *)local_188);
    local_160._0_4_ = local_138._0_4_;
    std::__cxx11::string::operator=((string *)&local_158,(string *)&_Stack_130);
    uVar2 = local_160._0_4_;
    pcVar8 = local_128 + 8;
    if (_Stack_130._M_p != pcVar8) {
      operator_delete(_Stack_130._M_p);
    }
    if (local_188 != (undefined1  [8])local_178) {
      operator_delete((void *)local_188);
    }
    if (uVar2 != none_type) goto LAB_001ba8b5;
    tlv::Tlv::Tlv((Tlv *)local_188,kNetworkDiagChildTable,aKeepAlive - 1U | 1,kMeshCoP);
    AppendTlv((Error *)local_138,&local_b8,(Tlv *)local_188);
    local_160._0_4_ = local_138._0_4_;
    std::__cxx11::string::operator=((string *)&local_158,(string *)&_Stack_130);
    uVar2 = local_160._0_4_;
    if (_Stack_130._M_p != pcVar8) {
      operator_delete(_Stack_130._M_p);
    }
    if (local_180 != (uchar *)0x0) {
      operator_delete(local_180);
    }
    if (uVar2 != none_type) goto LAB_001ba8b5;
    iVar4 = (*(this->super_Commissioner)._vptr_Commissioner[7])(this);
    tlv::Tlv::Tlv((Tlv *)local_188,kCommissionerSessionId,(uint16_t)iVar4,kMeshCoP);
    AppendTlv((Error *)local_138,&local_b8,(Tlv *)local_188);
    local_160._0_4_ = local_138._0_4_;
    std::__cxx11::string::operator=((string *)&local_158,(string *)&_Stack_130);
    uVar2 = local_160._0_4_;
    if (_Stack_130._M_p != pcVar8) {
      operator_delete(_Stack_130._M_p);
    }
    if (local_180 != (uchar *)0x0) {
      operator_delete(local_180);
    }
    if (uVar2 != none_type) goto LAB_001ba8b5;
    iVar4 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar4 != '\0') {
      SignRequest((Error *)local_138,this,&local_b8,kMeshCoP,false);
      local_160._0_4_ = local_138._0_4_;
      std::__cxx11::string::operator=((string *)&local_158,(string *)&_Stack_130);
      uVar2 = local_160._0_4_;
      if (_Stack_130._M_p != pcVar8) {
        operator_delete(_Stack_130._M_p);
      }
      if (uVar2 != none_type) goto LAB_001ba8b5;
    }
    uVar1 = (this->mConfig).mKeepAliveInterval;
    lVar5 = std::chrono::_V2::system_clock::now();
    Timer::Start(&this->mKeepAliveTimer,(TimePoint)((ulong)uVar1 * 1000000000 + lVar5));
    local_d8._8_8_ = 0;
    pcStack_c0 = std::
                 _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:1387:23)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:1387:23)>
               ::_M_manager;
    local_d8._M_unused._M_object = this;
    coap::CoapSecure::SendRequest(&this->mBrClient,&local_b8,(ResponseHandler *)&local_d8);
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,__destroy_functor);
    }
    local_188 = (undefined1  [8])local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"meshcop","");
    local_138._0_4_ = bool_type;
    pcVar8 = "sent keep alive message: keepAlive={}";
    _Stack_130._M_p = "sent keep alive message: keepAlive={}";
    local_128._0_8_ = 0x25;
    local_128._8_8_ = 0x100000000;
    local_128._16_8_ = local_138;
    local_110[0] = ::fmt::v10::detail::
                   parse_format_specs<bool,fmt::v10::detail::compile_parse_context<char>>;
    local_e8.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_128._16_8_;
    do {
      if (pcVar8 == "") break;
      pcVar6 = pcVar8;
      if (*pcVar8 == '{') {
LAB_001ba6cb:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_bool>_>::
        writer::operator()(&local_e8,pcVar8,pcVar6);
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,bool>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_138);
        bVar9 = true;
      }
      else {
        pcVar6 = pcVar8 + 1;
        bVar9 = pcVar6 != "";
        if (bVar9) {
          if (*pcVar6 != '{') {
            pcVar3 = pcVar8 + 2;
            do {
              pcVar6 = pcVar3;
              bVar9 = pcVar6 != "";
              if (pcVar6 == "") goto LAB_001ba6c7;
              pcVar3 = pcVar6 + 1;
            } while (*pcVar6 != '{');
          }
          bVar9 = true;
        }
LAB_001ba6c7:
        if (bVar9) goto LAB_001ba6cb;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_bool>_>::
        writer::operator()(&local_e8,pcVar8,"");
        bVar9 = false;
      }
    } while (bVar9);
    local_138 = (undefined1  [8])(ulong)aKeepAlive;
    fmt.size_ = 7;
    fmt.data_ = (char *)0x25;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_138;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_108,(v10 *)"sent keep alive message: keepAlive={}",fmt,args);
    Log(kDebug,(string *)local_188,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    _Var7._M_p = (pointer)local_188;
    if (local_188 == (undefined1  [8])local_178) goto LAB_001ba8b5;
  }
  operator_delete(_Var7._M_p);
LAB_001ba8b5:
  if (local_160._0_4_ != none_type) {
    local_188 = (undefined1  [8])local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"meshcop","");
    local_138._0_4_ = 0xd;
    pcVar8 = "sending keep alive message failed: {}";
    _Stack_130._M_p = "sending keep alive message failed: {}";
    local_128._0_8_ = 0x25;
    local_128._8_8_ = 0x100000000;
    local_110[0] = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_128._16_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_138;
    local_e8.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_138;
    do {
      if (pcVar8 == "") break;
      pcVar6 = pcVar8;
      if (*pcVar8 == '{') {
LAB_001ba967:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&local_e8,pcVar8,pcVar6);
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_138);
        bVar9 = true;
      }
      else {
        pcVar6 = pcVar8 + 1;
        bVar9 = pcVar6 != "";
        if (bVar9) {
          if (*pcVar6 != '{') {
            pcVar3 = pcVar8 + 2;
            do {
              pcVar6 = pcVar3;
              bVar9 = pcVar6 != "";
              if (pcVar6 == "") goto LAB_001ba963;
              pcVar3 = pcVar6 + 1;
            } while (*pcVar6 != '{');
          }
          bVar9 = true;
        }
LAB_001ba963:
        if (bVar9) goto LAB_001ba967;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&local_e8,pcVar8,"");
        bVar9 = false;
      }
    } while (bVar9);
    Error::ToString_abi_cxx11_((string *)local_138,(Error *)local_160);
    local_e8.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_138;
    pcStack_e0 = _Stack_130._M_p;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x25;
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)&local_e8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_108,(v10 *)"sending keep alive message failed: {}",fmt_00,args_01);
    Log(kWarn,(string *)local_188,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if (local_138 != (undefined1  [8])local_128) {
      operator_delete((void *)local_138);
    }
    if (local_188 != (undefined1  [8])local_178) {
      operator_delete((void *)local_188);
    }
    (*(this->super_Commissioner)._vptr_Commissioner[6])(this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_p != &local_148) {
    operator_delete(local_158._M_p);
  }
  return;
}

Assistant:

void CommissionerImpl::SendKeepAlive(Timer &, bool aKeepAlive)
{
    Error         error;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};
    auto          state = (aKeepAlive ? tlv::kStateAccept : tlv::kStateReject);

    auto onResponse = [this](const coap::Response *aResponse, Error aError) {
        Error error = HandleStateResponse(aResponse, aError);

        if (error == ErrorCode::kNone)
        {
            mKeepAliveTimer.Start(GetKeepAliveInterval());
            LOG_INFO(LOG_REGION_MESHCOP, "keep alive message accepted, keep-alive timer restarted");
        }
        else
        {
            mState = State::kDisabled;
            Resign([](Error) {});

            LOG_WARN(LOG_REGION_MESHCOP, "keep alive message rejected: {}", error.ToString());
        }

        mCommissionerHandler.OnKeepAliveResponse(error);
    };

    VerifyOrExit(IsActive(),
                 error = ERROR_INVALID_STATE("cannot send keep-alive message the commissioner is not active"));

    SuccessOrExit(error = request.SetUriPath(uri::kKeepAlive));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kState, state}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request, tlv::Scope::kMeshCoP, /* aAppendToken */ false));
    }
#endif

    mKeepAliveTimer.Start(GetKeepAliveInterval());

    mBrClient.SendRequest(request, onResponse);

    LOG_DEBUG(LOG_REGION_MESHCOP, "sent keep alive message: keepAlive={}", aKeepAlive);

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_WARN(LOG_REGION_MESHCOP, "sending keep alive message failed: {}", error.ToString());
        Disconnect();
    }
}